

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.h
# Opt level: O0

void __thiscall
slang::ast::CaseAssertionExpr::visitExprs<slang::ast::builtins::MonitorVisitor&>
          (CaseAssertionExpr *this,MonitorVisitor *visitor)

{
  iterator pIVar1;
  iterator ppEVar2;
  AssertionExpr *this_00;
  Expression *e;
  iterator __end4;
  iterator __begin4;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range4;
  ItemGroup *item;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *__range3;
  MonitorVisitor *visitor_local;
  CaseAssertionExpr *this_local;
  
  Expression::visit<slang::ast::builtins::MonitorVisitor&>(this->expr,visitor);
  __end3 = nonstd::span_lite::
           span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>::begin
                     (&this->items);
  pIVar1 = nonstd::span_lite::
           span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>::end
                     (&this->items);
  for (; __end3 != pIVar1; __end3 = __end3 + 1) {
    __end4 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
             begin(&__end3->expressions);
    ppEVar2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
              end(&__end3->expressions);
    for (; __end4 != ppEVar2; __end4 = __end4 + 1) {
      Expression::visit<slang::ast::builtins::MonitorVisitor&>(*__end4,visitor);
    }
    this_00 = not_null<const_slang::ast::AssertionExpr_*>::operator->(&__end3->body);
    AssertionExpr::visit<slang::ast::builtins::MonitorVisitor>(this_00,visitor);
  }
  if (this->defaultCase != (AssertionExpr *)0x0) {
    AssertionExpr::visit<slang::ast::builtins::MonitorVisitor>(this->defaultCase,visitor);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr.visit(visitor);
        for (auto& item : items) {
            for (auto e : item.expressions)
                e->visit(visitor);
            item.body->visit(visitor);
        }

        if (defaultCase)
            defaultCase->visit(visitor);
    }